

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O3

void __thiscall
merlin::cte::joint_marginal
          (cte *this,variable_set *scope,vector<int,_std::allocator<int>_> *evidence)

{
  factor *this_00;
  bool bVar1;
  pointer pnVar2;
  pointer pdVar3;
  ostream *poVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  long lVar8;
  cte *this_01;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  index_config cv1;
  variable_set v_rem;
  config_index cv2;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  config;
  factor local_138;
  variable_set local_d8;
  config_index local_98;
  
  pnVar2 = (this->m_clusters).
           super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_clusters).
      super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
      super__Vector_impl_data._M_finish != pnVar2) {
    lVar11 = 0xe0;
    uVar9 = 0;
    do {
      variable_set::operator&
                ((variable_set *)&local_138,(variable_set *)((long)pnVar2 + lVar11 + -0xd8),scope);
      bVar1 = variable_set::operator==((variable_set *)&local_138,scope);
      variable_set::~variable_set((variable_set *)&local_138);
      if (bVar1) {
        factor::factor(&local_138,scope,0.0);
        factor::operator=(&this->m_marginal,&local_138);
        factor::~factor(&local_138);
        pnVar2 = (this->m_clusters).
                 super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        this_00 = (factor *)((long)&pnVar2->id + lVar11);
        factor::condition(&local_138,(factor *)((long)pnVar2 + lVar11 + -0xa0),evidence);
        factor::operator=(this_00,&local_138);
        factor::~factor(&local_138);
        plVar10 = *(long **)((long)&(pnVar2->theta).v_.m_dlocal + lVar11);
        if (plVar10 != *(long **)((long)&(pnVar2->theta).v_.m_dlocal + lVar11 + 8U)) {
          do {
            lVar8 = *plVar10;
            pdVar3 = this_00[-3].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((pointer)**(undefined8 **)(lVar8 + 0x40) == pdVar3) {
              factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,lVar8 + 0x48);
              pdVar3 = this_00[-3].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
            if ((pointer)**(undefined8 **)(lVar8 + 0x38) == pdVar3) {
              factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,lVar8 + 0xa8);
            }
            plVar10 = plVar10 + 1;
          } while (plVar10 != *(long **)((long)&(pnVar2->theta).v_.m_dlocal + lVar11 + 8U));
        }
        local_d8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.m_d = (vsize *)0x0;
        lVar8 = *(long *)((long)pnVar2 + lVar11 + -0xd8);
        if (*(long *)((long)pnVar2 + lVar11 + -0xd0) != lVar8) {
          lVar12 = 0;
          do {
            local_138._vptr_factor = *(_func_int ***)(lVar8 + lVar12 * 8);
            local_138.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 *(pointer *)(*(long *)((long)pnVar2 + lVar11 + -0xa8) + lVar12 * 8);
            bVar1 = variable_set::contains(scope,(variable *)&local_138);
            if ((!bVar1) &&
               ((evidence->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start
                [*(long *)(*(long *)((long)pnVar2 + lVar11 + -0xd8) + lVar12 * 8)] < 0)) {
              local_138._vptr_factor =
                   *(_func_int ***)(*(long *)((long)pnVar2 + lVar11 + -0xd8) + lVar12 * 8);
              local_138.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   *(pointer *)(*(long *)((long)pnVar2 + lVar11 + -0xa8) + lVar12 * 8);
              variable_set::operator|=(&local_d8,(variable *)&local_138);
            }
            lVar12 = lVar12 + 1;
            lVar8 = *(long *)((long)pnVar2 + lVar11 + -0xd8);
          } while (lVar12 != *(long *)((long)pnVar2 + lVar11 + -0xd0) - lVar8 >> 3);
        }
        factor::sum(&local_138,this_00,&local_d8);
        factor::operator=(this_00,&local_138);
        factor::~factor(&local_138);
        if (this->m_debug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[DEBUG] Joint marginal scope: ",0x1e);
          poVar4 = operator<<((ostream *)&std::cout,&(this->m_marginal).v_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[DEBUG] Actual belief scope:  ",0x1e);
          poVar4 = operator<<((ostream *)&std::cout,this_00);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        index_config::index_config((index_config *)&local_138,&(this->m_marginal).v_,true);
        config_index::config_index
                  (&local_98,
                   (variable_set *)
                   ((long)&(pnVar2->clique).m_v.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                   lVar11),true);
        if ((this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar9 = 0;
          do {
            this_01 = (cte *)&stack0xffffffffffffffa0;
            index_config::convert
                      ((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                        *)&stack0xffffffffffffffa0,(index_config *)&local_138,uVar9);
            bVar1 = is_compatible(this_01,(map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                           *)&stack0xffffffffffffffa0,evidence);
            if (bVar1) {
              sVar5 = config_index::convert
                                (&local_98,
                                 (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&stack0xffffffffffffffa0);
              lVar8 = *(long *)((long)&(pnVar2->theta)._vptr_factor + lVar11);
              sVar6 = sVar5;
              if (((ulong)(*(long *)((long)&(pnVar2->theta).v_.m_v + lVar11) - lVar8 >> 3) <= sVar5)
                 || (pdVar3 = (this->m_marginal).t_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start, sVar6 = uVar9,
                    (ulong)((long)(this->m_marginal).t_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar3 >> 3) <= uVar9))
              {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,sVar6);
                goto LAB_0013b2e0;
              }
              dVar13 = *(double *)(lVar8 + sVar5 * 8);
            }
            else {
              pdVar3 = (this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              dVar13 = 0.0;
              if ((ulong)((long)(this->m_marginal).t_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar3 >> 3) <= uVar9) {
LAB_0013b2e0:
                uVar7 = std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar9);
                index_config::~index_config((index_config *)&local_138);
                variable_set::~variable_set(&local_d8);
                _Unwind_Resume(uVar7);
              }
            }
            pdVar3[uVar9] = dVar13;
            std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *)&stack0xffffffffffffffa0);
            uVar9 = uVar9 + 1;
          } while (uVar9 < (ulong)((long)(this->m_marginal).t_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   (long)(this->m_marginal).t_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start >> 3));
        }
        dVar13 = exp(this->m_logz);
        pdVar3 = (this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = (long)(this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3;
        if (lVar11 != 0) {
          lVar11 = lVar11 >> 3;
          lVar8 = 0;
          do {
            pdVar3[lVar8] = (double)((ulong)(pdVar3[lVar8] / dVar13) & -(ulong)(dVar13 != 0.0));
            lVar8 = lVar8 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar8);
        }
        if (this->m_debug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[DEBUG] Joint marginal: ",0x18);
          poVar4 = operator<<((ostream *)&std::cout,&this->m_marginal);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        if (local_98.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.m_vars.
                          super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_98.m_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.m_dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_138.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.v_.m_dlocal.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_138.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.v_.m_v.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        variable_set::~variable_set(&local_d8);
        return;
      }
      uVar9 = uVar9 + 1;
      pnVar2 = (this->m_clusters).
               super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x158;
    } while (uVar9 < (ulong)(((long)(this->m_clusters).
                                    super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar2 >> 3)
                            * -0x7d05f417d05f417d));
  }
  __assert_fail("found",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/cte.cpp",
                0x30d,"void merlin::cte::joint_marginal(const variable_set &, std::vector<int> &)");
}

Assistant:

void cte::joint_marginal(const variable_set& scope, std::vector<int>& evidence) {

	// Get the cluster that contains the scope
	bool found = false;
	size_t j = 0;
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		variable_set temp = (cl.clique & scope);
		if (temp == scope) {
			found = true;
			j = i;
			break;
		}
	}

	// Safety check
	assert(found);

	// Compute the joint marginal (belief) subject to evidence
	m_marginal = factor(scope, 0.0);
	detail::node& n = m_clusters[j];
	n.belief = n.theta.condition(evidence);
	for (std::vector<detail::edge*>::iterator ei = n.edges.begin();
			ei != n.edges.end(); ++ei) {
		detail::edge* e = (*ei);
		if (e->second->id == n.id) {
			n.belief *= e->fwd;
		}
		if (e->first->id == n.id) {
			n.belief *= e->bwd;
		}
	}

	// Update the belief entries subject to evidence
	variable_set v_rem;
	for (variable_set::const_iterator vi = n.clique.begin();
			vi != n.clique.end(); ++vi) {
		if (!scope.contains(*vi) && evidence[vi->label()] < 0) {
			v_rem |= *vi;
		}
	}
	n.belief = n.belief.sum(v_rem);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal scope: " << m_marginal.vars() << std::endl;
		std::cout << "[DEBUG] Actual belief scope:  " << n.belief << std::endl;
	}

	// Fill in all configurations of the marginal (including the evidence)
	index_config cv1(m_marginal.vars(), true);
	config_index cv2(n.belief.vars(), true);
	for (size_t i = 0; i < m_marginal.num_states(); ++i) {
		std::map<size_t, size_t> config = cv1.convert(i);
		if (is_compatible(config, evidence)) {
			size_t j = cv2.convert(config);
			double v = n.belief.get(j);
			m_marginal.set(i, v);
		} else {
			m_marginal.set(i, 0.0);
		}
	}

	// Normalize by P(evidence)
	m_marginal /= std::exp(m_logz);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal: " << m_marginal << std::endl;
	}
}